

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::traversedashwordlistdashfindfirst(Forth *this)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  Definition *defnLook;
  reverse_iterator iend;
  reverse_iterator i;
  uint wid;
  Forth *this_local;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDFIRST");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rbegin
            ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
             &iend);
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rend
            ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
             &defnLook);
  while( true ) {
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                      (&iend,(reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                              *)&defnLook);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ForthStack<unsigned_int>::setTop(&this->dStack,0);
      return;
    }
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
              ::operator*(&iend);
    bVar1 = Definition::isHidden(this_00);
    if ((!bVar1) && (this_00->searchOrder == uVar2)) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
    ::operator++(&iend);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,this_00->numberInVector);
  return;
}

Assistant:

void traversedashwordlistdashfindfirst(){
							REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDFIRST");
							auto wid = dStack.getTop(); 
							for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
								auto& defnLook = *i;
								//if (!defn.isFindable())
								if (defnLook.isHidden())
									continue;
								if(defnLook.searchOrder==wid){
									dStack.setTop(defnLook.numberInVector);
									return;
								}
							}
							dStack.setTop(0);	
		}